

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_test.cpp
# Opt level: O3

void __thiscall sign_verifycase::_impl<picnic_params_t>(sign_verifycase *this,anon_enum_32 *param)

{
  uint uVar1;
  result_type rVar2;
  int iVar3;
  anon_enum_32 aVar4;
  uint uVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t max_signature_size;
  size_t siglen;
  picnic_publickey_t public_key;
  array<unsigned_char,_32UL> m;
  picnic_privatekey_t private_key;
  pointer local_1538;
  element_type *peStack_1530;
  shared_count local_1528;
  assertion_result local_1520;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_1508;
  int local_14f4;
  _func_int *local_14f0;
  char *local_14e8;
  char *local_14e0;
  _func_int *local_14d8;
  lazy_ostream local_14d0;
  undefined1 *local_14c0;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_14b8;
  assertion_result local_14b0;
  char *local_1498;
  char *local_1468;
  char *local_1460;
  const_string local_1448;
  const_string local_1438;
  const_string local_1428;
  const_string local_1418;
  const_string local_1408;
  const_string local_13f8;
  const_string local_13e8;
  const_string local_13d8;
  const_string local_13c8;
  undefined1 local_13b8 [5000];
  
  local_14b0.m_message.px._0_1_ = 0;
  local_14b0._0_8_ = &PTR__lazy_ostream_00183670;
  local_14b0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1498 = "Parameter set: ";
  local_1468 = (char *)picnic_get_param_name(*param);
  local_13b8._16_8_ = &local_14b0;
  local_13b8[8] = false;
  local_13b8._0_8_ = &PTR__lazy_ostream_00185768;
  local_13b8._24_8_ = &local_1468;
  local_14f4 = boost::unit_test::framework::add_context((lazy_ostream *)local_13b8,true);
  local_14f0 = (_func_int *)picnic_signature_size(*param);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  local_14d0._vptr_lazy_ostream = &local_14f0;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1b;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            (&local_14b0,(value_expr<const_unsigned_long_&> *)&local_14d0,false);
  local_1468 = "max_signature_size";
  local_13b8[8] = false;
  local_13c8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_13c8.m_end = "";
  local_1460 = "";
  local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
  local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_13b8._24_8_ = &local_1468;
  boost::test_tools::tt_detail::report_assertion
            (&local_14b0,(lazy_ostream *)local_13b8,&local_13c8,0x1b,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_14b0.m_message.pn);
  local_14b0._0_8_ = (param_type)0xff00000000;
  std::random_device::random_device((random_device *)local_13b8);
  uVar1 = std::random_device::_M_getval();
  uVar5 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_14d0._vptr_lazy_ostream = (_func_int **)(ulong)(uVar5 + uVar1 + (uint)(uVar1 + uVar5 == 0));
  lVar6 = 0;
  do {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_14b0,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &local_14d0,(param_type *)&local_14b0);
    *(char *)((long)&local_1468 + lVar6) = (char)rVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  std::random_device::_M_fini();
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x23;
  iVar3 = picnic_keygen(*param,&local_14b0,local_13b8);
  local_1508.m_lhs.m_value._0_1_ = iVar3 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_1538,(value_expr<bool> *)&local_1508,false);
  local_14b8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_1520;
  local_1520._0_8_ = "!picnic_keygen(param, &public_key, &private_key)";
  local_14d0.m_empty = false;
  local_13d8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_13d8.m_end = "";
  local_1520.m_message.px = (element_type *)0x164b78;
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1538,&local_14d0,&local_13d8,0x23,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1528);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x26;
  aVar4 = picnic_get_public_key_param(&local_14b0);
  local_1520.m_message.px = (element_type *)param;
  local_1520._0_4_ = aVar4;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
  ::evaluate((assertion_result *)&local_1538,
             (binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
              *)&local_1520,false);
  local_1508.m_lhs.m_value = (unsigned_long *)0x164b79;
  local_14d0.m_empty = false;
  local_13e8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_13e8.m_end = "";
  local_1508.m_rhs = (unsigned_long *)0x164baa;
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = &local_1508;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1538,&local_14d0,&local_13e8,0x26,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1528);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x27;
  local_1520._0_4_ = picnic_get_private_key_param(local_13b8);
  local_1520.m_message.px = (element_type *)param;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
  ::evaluate((assertion_result *)&local_1538,
             (binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
              *)&local_1520,false);
  local_1508.m_lhs.m_value = (unsigned_long *)0x164bab;
  local_14d0.m_empty = false;
  local_13f8.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_13f8.m_end = "";
  local_1508.m_rhs = (unsigned_long *)0x164bde;
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = &local_1508;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1538,&local_14d0,&local_13f8,0x27,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1528);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x28;
  iVar3 = picnic_validate_keypair(local_13b8,&local_14b0);
  local_1508.m_lhs.m_value._0_1_ = iVar3 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_1538,(value_expr<bool> *)&local_1508,false);
  local_1520._0_8_ = "!picnic_validate_keypair(&private_key, &public_key)";
  local_14d0.m_empty = false;
  local_1408.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1408.m_end = "";
  local_1520.m_message.px = (element_type *)0x164c12;
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_1520;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1538,&local_14d0,&local_1408,0x28,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1528);
  local_1528.pi_ = (sp_counted_base *)0x0;
  local_1538 = (pointer)0x0;
  peStack_1530 = (element_type *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1538,
             (size_type)local_14f0);
  local_14d8 = local_14f0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2f;
  iVar3 = picnic_sign(local_13b8,&local_1468,0x20,local_1538,&local_14d8);
  local_14e8 = (char *)CONCAT71(local_14e8._1_7_,iVar3 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1520,(value_expr<bool> *)&local_14e8,false);
  local_1508.m_lhs.m_value = (unsigned_long *)0x164c13;
  local_14d0.m_empty = false;
  local_1418.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1418.m_end = "";
  local_1508.m_rhs = (unsigned_long *)0x164c56;
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = &local_1508;
  boost::test_tools::tt_detail::report_assertion
            (&local_1520,&local_14d0,&local_1418,0x2f,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1520.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x30;
  local_1508.m_rhs = (unsigned_long *)((ulong)local_1508.m_rhs & 0xffffffff00000000);
  local_1508.m_lhs.m_value = (unsigned_long *)&local_14d8;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_1520,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_1508,false);
  local_14e8 = "siglen > 0";
  local_14d0.m_empty = false;
  local_1428.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1428.m_end = "";
  local_14e0 = "";
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_14e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1520,&local_14d0,&local_1428,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1520.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  local_1508.m_rhs = (unsigned_long *)&local_14f0;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x31;
  local_1508.m_lhs.m_value = (unsigned_long *)&local_14d8;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_1520,&local_1508,false);
  local_14e8 = "siglen <= max_signature_size";
  local_14d0.m_empty = false;
  local_1438.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1438.m_end = "";
  local_14e0 = "";
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)&local_14e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1520,&local_14d0,&local_1438,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1520.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1888d0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x166d83);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x33;
  iVar3 = picnic_verify(&local_14b0,&local_1468,0x20,local_1538,local_14d8);
  local_14e8 = (char *)CONCAT71(local_14e8._1_7_,iVar3 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1520,(value_expr<bool> *)&local_14e8,false);
  local_1508.m_lhs.m_value = (unsigned_long *)0x164c7f;
  local_14d0.m_empty = false;
  local_1448.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp";
  local_1448.m_end = "";
  local_1508.m_rhs = (unsigned_long *)0x164cc2;
  local_14d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001857a8;
  local_14c0 = boost::unit_test::lazy_ostream::inst;
  local_14b8 = &local_1508;
  boost::test_tools::tt_detail::report_assertion
            (&local_1520,&local_14d0,&local_1448,0x33,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1520.m_message.pn);
  iVar3 = local_14f4;
  if (local_1538 != (pointer)0x0) {
    operator_delete(local_1538);
  }
  boost::unit_test::framework::clear_context(iVar3);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(sign_verify, all_supported_parameters(), param) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(param)) {
    const size_t max_signature_size = picnic_signature_size(param);
    BOOST_TEST(max_signature_size);

    std::array<uint8_t, 32> m;
    randomize_container(m);

    // Create a key pair
    picnic_privatekey_t private_key;
    picnic_publickey_t public_key;
    BOOST_TEST(!picnic_keygen(param, &public_key, &private_key));

    // Valid key pair
    BOOST_TEST(picnic_get_public_key_param(&public_key) == param);
    BOOST_TEST(picnic_get_private_key_param(&private_key) == param);
    BOOST_TEST(!picnic_validate_keypair(&private_key, &public_key));

    std::vector<uint8_t> sig;
    sig.resize(max_signature_size);
    size_t siglen = max_signature_size;

    // Sign a message
    BOOST_TEST(!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen));
    BOOST_TEST(siglen > 0);
    BOOST_TEST(siglen <= max_signature_size);
    // Verify signature
    BOOST_TEST(!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen));
  }
}